

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_Leader::GetTextDirection(ON_OBSOLETE_V5_Leader *this,ON_2dVector *text_dir)

{
  int iVar1;
  ON_2dPoint *pOVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ON_2dVector OVar8;
  
  iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (iVar1 < 2) {
    ON_2dVector::Set(text_dir,-1.0,0.0);
    bVar5 = false;
  }
  else {
    uVar6 = (ulong)(iVar1 - 1);
    uVar7 = uVar6;
    lVar3 = uVar6 * 0x10;
    while( true ) {
      bVar5 = 0 < (long)uVar7;
      if ((long)uVar7 < 1) break;
      pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      OVar8 = ON_2dPoint::operator-(pOVar2 + uVar6,(ON_2dPoint *)((long)&pOVar2[-1].x + lVar3));
      *text_dir = OVar8;
      bVar4 = ON_2dVector::Unitize(text_dir);
      if (bVar4) {
        return bVar5;
      }
      ON_2dVector::Set(text_dir,-1.0,0.0);
      uVar7 = uVar7 - 1;
      lVar3 = lVar3 + -0x10;
    }
  }
  return bVar5;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetTextDirection( ON_2dVector& text_dir ) const 
{
  bool rc = false;
  const int point_count = m_points.Count();
  if ( point_count < 2 )
  {
    text_dir.Set(-1.0,0.0);
  }
  else
  {
    int i; // 20 June 2011 Fixed textdir for leaders with 2 points. rr86801
    for(i = point_count-1; i >= 1; i--)
    {
      text_dir = m_points[point_count-1] -  m_points[i-1];
      if(text_dir.Unitize())
      {
        rc = true;
        break;
      }
      text_dir.Set(-1.0,0.0);
    }
  }
  return rc;
}